

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

size_t cimg_library::cimg::fread<short>(short *ptr,size_t nmemb,FILE *stream)

{
  size_t sVar1;
  CImgArgumentException *this;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  size_t __n;
  
  if ((ptr != (short *)0x0) && (stream != (FILE *)0x0)) {
    sVar4 = 0;
    sVar2 = nmemb;
    if (nmemb != 0) {
      do {
        __n = 0x1f80000;
        if (sVar2 * 2 < 0x3f00000) {
          __n = sVar2;
        }
        sVar1 = fread(ptr + sVar4,2,__n,(FILE *)stream);
        sVar4 = sVar4 + sVar1;
        sVar2 = sVar2 - sVar1;
      } while ((__n == sVar1) && (sVar2 != 0));
      if (sVar2 != 0) {
        warn("cimg::fread(): Only %lu/%lu elements could be read from file.",sVar4,nmemb);
      }
    }
    return sVar4;
  }
  this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  pcVar3 = "";
  if (1 < nmemb) {
    pcVar3 = "s";
  }
  CImgArgumentException::CImgArgumentException
            (this,"cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
             nmemb,"short",pcVar3,stream,ptr);
  __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
}

Assistant:

inline size_t fread(T *const ptr, const size_t nmemb, std::FILE *stream) {
      if (!ptr || !stream)
        throw CImgArgumentException("cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
                                    nmemb,cimg::type<T>::string(),nmemb>1?"s":"",stream,ptr);
      if (!nmemb) return 0;
      const size_t wlimitT = 63*1024*1024, wlimit = wlimitT/sizeof(T);
      size_t to_read = nmemb, al_read = 0, l_to_read = 0, l_al_read = 0;
      do {
        l_to_read = (to_read*sizeof(T))<wlimitT?to_read:wlimit;
        l_al_read = std::fread((void*)(ptr + al_read),sizeof(T),l_to_read,stream);
        al_read+=l_al_read;
        to_read-=l_al_read;
      } while (l_to_read==l_al_read && to_read>0);
      if (to_read>0)
        warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
             (unsigned long)al_read,(unsigned long)nmemb);
      return al_read;
    }